

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

ConvexH * ConvexDecomposition::test_btbq(void)

{
  undefined8 uVar1;
  float3 *pfVar2;
  Plane *pPVar3;
  HalfEdge *pHVar4;
  ConvexH *this;
  char *__function;
  undefined1 auVar5 [16];
  
  this = (ConvexH *)::operator_new(0x30);
  ConvexH::ConvexH(this,4,8,2);
  if (0 < (this->vertices).count) {
    pfVar2 = (this->vertices).element;
    pfVar2->x = 0.0;
    pfVar2->y = 0.0;
    pfVar2->z = 0.0;
    if (1 < (this->vertices).count) {
      uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      pfVar2[1].x = (float)(int)uVar1;
      pfVar2[1].y = (float)(int)((ulong)uVar1 >> 0x20);
      pfVar2[1].z = 0.0;
      if (2 < (this->vertices).count) {
        auVar5._8_4_ = 0x3f800000;
        auVar5._0_8_ = 0x3f8000003f800000;
        auVar5._12_4_ = 0x3f800000;
        uVar1 = vmovlps_avx(auVar5);
        pfVar2[2].x = (float)(int)uVar1;
        pfVar2[2].y = (float)(int)((ulong)uVar1 >> 0x20);
        pfVar2[2].z = 0.0;
        if (3 < (this->vertices).count) {
          pfVar2[3].x = 0.0;
          pfVar2[3].y = 1.0;
          pfVar2[3].z = 0.0;
          if (0 < (this->facets).count) {
            pPVar3 = (this->facets).element;
            (pPVar3->normal).x = 0.0;
            (pPVar3->normal).y = 0.0;
            *(undefined8 *)&(pPVar3->normal).z = 0x3f800000;
            if (1 < (this->facets).count) {
              pPVar3[1].normal.x = 0.0;
              pPVar3[1].normal.y = 0.0;
              *(undefined8 *)&pPVar3[1].normal.z = 0xbf800000;
              if (((((0 < (this->edges).count) &&
                    (pHVar4 = (this->edges).element, pHVar4->ea = 7, pHVar4->v = '\0',
                    pHVar4->p = '\0', 1 < (this->edges).count)) &&
                   (pHVar4 = (this->edges).element, pHVar4[1].ea = 6, pHVar4[1].v = '\x01',
                   pHVar4[1].p = '\0', 2 < (this->edges).count)) &&
                  ((pHVar4 = (this->edges).element, pHVar4[2].ea = 5, pHVar4[2].v = '\x02',
                   pHVar4[2].p = '\0', 3 < (this->edges).count &&
                   (pHVar4 = (this->edges).element, pHVar4[3].ea = 4, pHVar4[3].v = '\x03',
                   pHVar4[3].p = '\0', 4 < (this->edges).count)))) &&
                 ((pHVar4 = (this->edges).element, pHVar4[4].ea = 3, pHVar4[4].v = '\0',
                  pHVar4[4].p = '\x01', 5 < (this->edges).count &&
                  ((pHVar4 = (this->edges).element, pHVar4[5].ea = 2, pHVar4[5].v = '\x03',
                   pHVar4[5].p = '\x01', 6 < (this->edges).count &&
                   (pHVar4 = (this->edges).element, pHVar4[6].ea = 1, pHVar4[6].v = '\x02',
                   pHVar4[6].p = '\x01', 7 < (this->edges).count)))))) {
                pHVar4 = (this->edges).element;
                pHVar4[7].ea = 0;
                pHVar4[7].v = '\x01';
                pHVar4[7].p = '\x01';
                AssertIntact(this);
                return this;
              }
              __function = 
              "Type &ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
              ;
              goto LAB_00904c5f;
            }
          }
          __function = 
          "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::operator[](int) [Type = ConvexDecomposition::Plane]"
          ;
          goto LAB_00904c5f;
        }
      }
    }
  }
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
  ;
LAB_00904c5f:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,__function);
}

Assistant:

ConvexH *test_btbq() {
	ConvexH *convex = new ConvexH(4,8,2);
	convex->vertices[0] = REAL3(0,0,0);
	convex->vertices[1] = REAL3(1,0,0);
	convex->vertices[2] = REAL3(1,1,0);
	convex->vertices[3] = REAL3(0,1,0);
	convex->facets[0] = Plane(REAL3(0,0,1),0);
	convex->facets[1] = Plane(REAL3(0,0,-1),0);
	convex->edges[0]  = HalfEdge(7,0,0);
	convex->edges[1]  = HalfEdge(6,1,0);
	convex->edges[2]  = HalfEdge(5,2,0);
	convex->edges[3]  = HalfEdge(4,3,0);

	convex->edges[4]  = HalfEdge(3,0,1);
	convex->edges[5]  = HalfEdge(2,3,1);
	convex->edges[6]  = HalfEdge(1,2,1);
	convex->edges[7]  = HalfEdge(0,1,1);
	AssertIntact(*convex);
	return convex;
}